

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O2

apx_error_t
calc_init_data_size(apx_portInstance_t *port_list,apx_size_t num_ports,apx_size_t *total_size)

{
  uint32_t uVar1;
  apx_error_t aVar2;
  ulong uVar3;
  bool bVar4;
  
  if (port_list == (apx_portInstance_t *)0x0) {
    aVar2 = 1;
  }
  else {
    *total_size = 0;
    uVar3 = (ulong)num_ports;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      uVar1 = apx_portInstance_data_size(port_list);
      if (uVar1 == 0) {
        __assert_fail("data_size > 0u",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                      ,0x463,
                      "apx_error_t calc_init_data_size(apx_portInstance_t *, apx_size_t, apx_size_t *)"
                     );
      }
      *total_size = *total_size + uVar1;
      port_list = port_list + 1;
    }
    aVar2 = 0;
  }
  return aVar2;
}

Assistant:

static apx_error_t calc_init_data_size(apx_portInstance_t* port_list, apx_size_t num_ports, apx_size_t* total_size)
{
   if ((port_list == NULL) || (num_ports == 0))
   {
      return APX_INVALID_ARGUMENT_ERROR;
   }
   *total_size = 0u;
   for (apx_size_t port_id = 0u; port_id < num_ports; port_id++)
   {
      apx_size_t data_size = apx_portInstance_data_size(&port_list[port_id]);
      assert(data_size > 0u);
      *total_size += data_size;
   }
   return APX_NO_ERROR;
}